

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::FunctionProxy::Copy(FunctionProxy *this,FunctionProxy *other)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  undefined4 *puVar4;
  List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>
  *ptr;
  byte bVar5;
  
  if (other == (FunctionProxy *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x5d2,"(other)","other");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  bVar3 = other->field_0x44 & 0xfd | this->field_0x44 & 2;
  other->field_0x44 = bVar3;
  bVar5 = this->field_0x44;
  if ((bVar5 & 4) != 0) {
    bVar3 = bVar3 | 4;
    other->field_0x44 = bVar3;
    bVar5 = this->field_0x44;
  }
  if ((bVar5 & 8) != 0) {
    other->field_0x44 = bVar3 | 8;
  }
  Memory::WriteBarrierPtr<Js::ScriptFunctionType>::operator=
            (&other->deferredPrototypeType,&this->deferredPrototypeType);
  Memory::WriteBarrierPtr<Js::ScriptFunctionType>::operator=
            (&other->undeferredFunctionType,&this->undeferredFunctionType);
  ptr = GetAuxPtr<(Js::FunctionProxy::AuxPointerType)7,JsUtil::List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>*,Memory::Recycler,false,Js::WeakRefFreeListedRemovePolicy,DefaultComparer>*>
                  (this);
  SetAuxPtr<(Js::FunctionProxy::AuxPointerType)7,JsUtil::List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>*,Memory::Recycler,false,Js::WeakRefFreeListedRemovePolicy,DefaultComparer>*>
            (other,ptr);
  return;
}

Assistant:

void FunctionProxy::Copy(FunctionProxy* other)
    {
        Assert(other);

        other->SetIsTopLevel(this->m_isTopLevel);

        if (this->IsPublicLibraryCode())
        {
            other->SetIsPublicLibraryCode();
        }

        if (this->IsJsBuiltInCode())
        {
            other->SetIsJsBuiltInCode();
        }

#define CopyDeferParseField(field) other->field = this->field;
        CopyDeferParseField(deferredPrototypeType);
        CopyDeferParseField(undeferredFunctionType);
#undef CopyDeferParseField

        other->SetFunctionObjectTypeList(this->GetFunctionObjectTypeList());
    }